

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSat.c
# Opt level: O2

void Cec2_ManSimulateCis(Gia_Man_t *p)

{
  int iObj;
  Gia_Obj_t *pObj;
  word *pwVar1;
  word wVar2;
  long lVar3;
  int i;
  int v;
  
  for (v = 0; v < p->vCis->nSize; v = v + 1) {
    pObj = Gia_ManCi(p,v);
    iObj = Gia_ObjId(p,pObj);
    if (iObj == 0) break;
    pwVar1 = Cec2_ObjSim(p,iObj);
    for (lVar3 = 0; lVar3 < p->nSimWords; lVar3 = lVar3 + 1) {
      wVar2 = Gia_ManRandomW(0);
      pwVar1[lVar3] = wVar2;
    }
    *pwVar1 = *pwVar1 << 1;
  }
  p->iPatsPi = 0;
  return;
}

Assistant:

void Cec2_ManSimulateCis( Gia_Man_t * p )
{
    int i, Id;
    Gia_ManForEachCiId( p, Id, i )
        Cec2_ObjSimCi( p, Id );
    p->iPatsPi = 0;
}